

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O2

JoypadStateIter joypad_get_next_state(JoypadStateIter iter)

{
  JoypadChunk *pJVar1;
  JoypadStateIter JVar2;
  JoypadStateIter JVar3;
  JoypadStateIter JVar4;
  
  pJVar1 = iter.chunk;
  if (((long)iter.state - (long)pJVar1->data >> 4) + 1U < pJVar1->size) {
    JVar2.state = iter.state + 1;
    JVar2.chunk = pJVar1;
    return JVar2;
  }
  pJVar1 = pJVar1->next;
  if (pJVar1->size != 0) {
    JVar3.state = pJVar1->data;
    JVar3.chunk = pJVar1;
    return JVar3;
  }
  JVar4.state = (JoypadState *)0x0;
  JVar4.chunk = pJVar1;
  return JVar4;
}

Assistant:

JoypadStateIter joypad_get_next_state(JoypadStateIter iter) {
  size_t index = iter.state - iter.chunk->data;
  if (index + 1 < iter.chunk->size) {
    ++iter.state;
    return iter;
  }

  iter.chunk = iter.chunk->next;
  iter.state = iter.chunk->size != 0 ? iter.chunk->data : NULL;
  return iter;
}